

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O0

void possibleMovesRooks(U64 rBoard,U64 FriendlyPieces,U64 EnemyPieces,castleBools castleInfo,
                       bool black,arrayMoveList *possibleMoves)

{
  int iVar1;
  U64 UVar2;
  ulong uStack_58;
  int j;
  U64 attacks;
  ulong uStack_48;
  int square;
  U64 occupied;
  U64 pieces;
  arrayMoveList *possibleMoves_local;
  U64 UStack_28;
  bool black_local;
  U64 EnemyPieces_local;
  U64 FriendlyPieces_local;
  U64 rBoard_local;
  castleBools castleInfo_local;
  
  uStack_48 = FriendlyPieces | EnemyPieces;
  occupied = rBoard;
  pieces = (U64)possibleMoves;
  possibleMoves_local._7_1_ = black;
  UStack_28 = EnemyPieces;
  EnemyPieces_local = FriendlyPieces;
  FriendlyPieces_local = rBoard;
  rBoard_local._4_4_ = castleInfo;
  while (occupied != 0) {
    attacks._4_4_ = bitPop(&occupied);
    uStack_58 = 0;
    UVar2 = getNegativeRayAttacks(uStack_48,EnemyPieces_local,0,attacks._4_4_);
    uStack_58 = UVar2 | uStack_58;
    UVar2 = getNegativeRayAttacks(uStack_48,EnemyPieces_local,3,attacks._4_4_);
    uStack_58 = UVar2 | uStack_58;
    UVar2 = getPositiveRayAttacks(uStack_48,EnemyPieces_local,4,attacks._4_4_);
    uStack_58 = UVar2 | uStack_58;
    UVar2 = getPositiveRayAttacks(uStack_48,EnemyPieces_local,5,attacks._4_4_);
    uStack_58 = UVar2 | uStack_58;
    while (uStack_58 != 0) {
      iVar1 = bitPop(&stack0xffffffffffffffa8);
      arrayMoveList::create((arrayMoveList *)pieces,(byte)attacks._4_4_,(byte)iVar1);
    }
  }
  if ((possibleMoves_local._7_1_ & 1) == 0) {
    if ((((uint)rBoard_local._4_4_ & 1) != 0) && (((EnemyPieces_local | UStack_28) & 0x70) == 0)) {
      arrayMoveList::create((arrayMoveList *)pieces,'<',':','\x01');
    }
    if ((((uint)rBoard_local._4_4_ & 0x100) != 0) && (((EnemyPieces_local | UStack_28) & 6) == 0)) {
      arrayMoveList::create((arrayMoveList *)pieces,'<','>','\x01');
    }
  }
  else {
    if ((((uint)rBoard_local._4_4_ & 0x10000) != 0) &&
       (((EnemyPieces_local | UStack_28) & 0x7000000000000000) == 0)) {
      arrayMoveList::create((arrayMoveList *)pieces,'\x04','\x02','\x01');
    }
    if ((((uint)rBoard_local._4_4_ & 0x1000000) != 0) &&
       (((EnemyPieces_local | UStack_28) & 0x600000000000000) == 0)) {
      arrayMoveList::create((arrayMoveList *)pieces,'\x04','\x06','\x01');
    }
  }
  return;
}

Assistant:

void possibleMovesRooks(const U64 rBoard, const U64 FriendlyPieces, const U64 EnemyPieces, castleBools castleInfo, bool black, arrayMoveList& possibleMoves) {
  U64 pieces = rBoard;

  const U64 occupied = FriendlyPieces | EnemyPieces;

  while(pieces) {
    int square = bitPop(pieces);
    U64 attacks = 0ULL;

    attacks |= getNegativeRayAttacks(occupied, FriendlyPieces, 0, square);
    attacks |= getNegativeRayAttacks(occupied, FriendlyPieces, 3, square);
    attacks |= getPositiveRayAttacks(occupied, FriendlyPieces, 4, square);
    attacks |= getPositiveRayAttacks(occupied, FriendlyPieces, 5, square);

    while(attacks) {
      int j = bitPop(attacks);
      possibleMoves.create(square, j);
    }
  }

	if(black) {
		if(castleInfo.blackACan) {
			if(!(8070450532247928832ULL & (FriendlyPieces | EnemyPieces) )) // Checks for pieces between the rook and king
				possibleMoves.create(4, 2, 1);
		}
		if(castleInfo.blackHCan) {
			if(!(432345564227567616ULL & (FriendlyPieces | EnemyPieces) ))
				possibleMoves.create(4, 6, 1);
		}
	} else {
		if(castleInfo.whiteACan) {
			if(!(112ULL & (FriendlyPieces | EnemyPieces) ))
				possibleMoves.create(60, 58, 1);
		}
		if(castleInfo.whiteHCan) {
			if(!(6ULL & (FriendlyPieces | EnemyPieces) ))
				possibleMoves.create(60, 62, 1);
		}
	}
}